

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::MergeWireAssignmentsVisitor::create_new_assignment
               (StmtBlock *block,
               vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               *stmts,Var *left,Var *right)

{
  bool bVar1;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  element_type *peVar2;
  Generator *pGVar3;
  element_type *peVar4;
  pair<const_char_*,_int> pVar5;
  int local_cc;
  pair<const_char_*,_int> local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_b0;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_a8;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_a0;
  const_iterator local_98;
  __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_90;
  shared_ptr<kratos::AssignStmt> *stmt;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range3;
  Generator *generator;
  enable_shared_from_this<kratos::Var> local_48;
  undefined1 local_38 [8];
  shared_ptr<kratos::AssignStmt> new_stmt;
  Var *right_local;
  Var *left_local;
  vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *stmts_local;
  StmtBlock *block_local;
  
  new_stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)right;
  bVar1 = std::
          vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
          ::empty(stmts);
  if (!bVar1) {
    std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_48);
    this = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::
           vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::operator[](stmts,0);
    peVar2 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this);
    AssignStmt::assign_type(peVar2);
    Var::assign((Var *)local_38,(shared_ptr<kratos::Var> *)left,(AssignmentType)&local_48);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_48);
    std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
              ((shared_ptr<kratos::Stmt> *)&generator,(shared_ptr<kratos::AssignStmt> *)local_38);
    StmtBlock::add_stmt(block,(shared_ptr<kratos::Stmt> *)&generator);
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&generator);
    pGVar3 = get_parent(block);
    if ((pGVar3->debug & 1U) != 0) {
      __end3 = std::
               vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               ::begin(stmts);
      stmt = (shared_ptr<kratos::AssignStmt> *)
             std::
             vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
             ::end(stmts);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::shared_ptr<kratos::AssignStmt>_*,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>
                                         *)&stmt), bVar1) {
        local_90 = (__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)__gnu_cxx::
                      __normal_iterator<const_std::shared_ptr<kratos::AssignStmt>_*,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>
                      ::operator*(&__end3);
        peVar2 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
        peVar4 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
        local_a0._M_current =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::end(&(peVar4->super_Stmt).super_IRNode.fn_name_ln);
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::string,unsigned_int>const*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>
        ::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*>
                  ((__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>const*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>
                    *)&local_98,&local_a0);
        peVar4 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_90);
        local_a8._M_current =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::begin(&(peVar4->super_Stmt).super_IRNode.fn_name_ln);
        peVar4 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_90);
        local_b0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ::end(&(peVar4->super_Stmt).super_IRNode.fn_name_ln);
        local_b8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)std::
                      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      ::
                      insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
                                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                                  *)&(peVar2->super_Stmt).super_IRNode.fn_name_ln,local_98,local_a8,
                                 (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                                  )local_b0);
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<kratos::AssignStmt>_*,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>
        ::operator++(&__end3);
      }
      peVar2 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      local_cc = 0x1f7;
      pVar5 = std::make_pair<char_const(&)[81],int>
                        ((char (*) [81])
                         "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/optimize.cc"
                         ,&local_cc);
      local_c8.first = pVar5.first;
      local_c8.second = pVar5.second;
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::pair<char_const*,int>>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)&(peVar2->super_Stmt).super_IRNode.fn_name_ln,&local_c8);
    }
    std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_38);
  }
  return;
}

Assistant:

static void create_new_assignment(StmtBlock* block,
                                      const std::vector<std::shared_ptr<AssignStmt>>& stmts,
                                      Var* const left, Var* const right) {
        if (stmts.empty()) return;
        // use the first assignment type. assume all the assignment has passed the
        // mixed assignment check
        auto new_stmt = left->assign(right->shared_from_this(), stmts[0]->assign_type());
        block->add_stmt(new_stmt);
        auto* generator = get_parent(block);
        if (generator->debug) {
            // merge all the statements
            for (auto const& stmt : stmts) {
                new_stmt->fn_name_ln.insert(new_stmt->fn_name_ln.end(), stmt->fn_name_ln.begin(),
                                            stmt->fn_name_ln.end());
            }
            new_stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }
    }